

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v9::detail::format_dragon
               (basic_fp<unsigned___int128> value,uint flags,int num_digits,buffer<char> *buf,
               int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  char *pcVar5;
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 value_00 [16];
  int iVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  runtime_error *this;
  uint uVar10;
  bigint *lhs2;
  ulong uVar11;
  long lVar12;
  int iVar13;
  bigint numerator;
  bigint denominator;
  bigint lower;
  bigint upper_store;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  bigint *this_00;
  bigint *pbVar14;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  uVar9 = (ulong)(uint)num_digits;
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001e7200;
  puVar1 = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001e7200;
  puVar2 = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001e7200;
  puVar3 = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  this_00 = &local_e0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001e7200;
  puVar4 = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  iVar13 = (flags & 1) + 1;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar4;
  if (value.e < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_2f0,-*exp10);
      bigint::assign(&local_190,&local_2f0);
      if ((flags & 1) == 0) {
        this_00 = (bigint *)0x0;
      }
      else {
        this_00 = &local_e0;
        bigint::assign(this_00,&local_2f0);
        bigint::operator<<=(&local_e0,1);
      }
      value_00._8_8_ = buf;
      value_00._0_8_ = this_00;
      bigint::multiply<unsigned___int128,_0>(&local_2f0,(unsigned___int128)value_00);
      bigint::operator<<=(&local_2f0,iVar13);
      bigint::assign<unsigned_long,_0>(&local_240,1);
      bigint::operator<<=(&local_240,iVar13 - value.e);
    }
    else {
      n_00._8_8_ = buf;
      n_00._0_8_ = this_00;
      bigint::assign<unsigned___int128,_0>(&local_2f0,(unsigned___int128)n_00);
      bigint::operator<<=(&local_2f0,iVar13);
      bigint::assign_pow10(&local_240,*exp10);
      bigint::operator<<=(&local_240,iVar13 - value.e);
      bigint::assign<unsigned_long,_0>(&local_190,1);
      if ((flags & 1) == 0) {
        this_00 = (bigint *)0x0;
      }
      else {
        bigint::assign<unsigned_long,_0>(&local_e0,2);
      }
    }
  }
  else {
    n._4_4_ = in_stack_fffffffffffffcbc;
    n._0_4_ = in_stack_fffffffffffffcb8;
    n._8_8_ = buf;
    bigint::assign<unsigned___int128,_0>(&local_2f0,(unsigned___int128)n);
    bigint::operator<<=(&local_2f0,value.e + iVar13);
    bigint::assign<unsigned_long,_0>(&local_190,1);
    bigint::operator<<=(&local_190,value.e);
    if ((flags & 1) == 0) {
      this_00 = (bigint *)0x0;
    }
    else {
      this_00 = &local_e0;
      bigint::assign<unsigned_long,_0>(this_00,1);
      bigint::operator<<=(&local_e0,value.e + 1);
    }
    bigint::assign_pow10(&local_240,*exp10);
    bigint::operator<<=(&local_240,iVar13);
  }
  uVar10 = ~(uint)value.f & 1;
  lhs2 = &local_190;
  if (this_00 != (bigint *)0x0) {
    lhs2 = this_00;
  }
  if ((flags & 2) != 0) {
    pbVar14 = this_00;
    iVar13 = add_compare(&local_2f0,lhs2,&local_240);
    if (iVar13 + uVar10 == 0 || SCARRY4(iVar13,uVar10) != (int)(iVar13 + uVar10) < 0) {
      *exp10 = *exp10 + -1;
      bigint::multiply(&local_2f0,10);
      if ((num_digits < 0) && (bigint::multiply(&local_190,10), this_00 != (bigint *)0x0)) {
        bigint::multiply(this_00,10);
      }
    }
    this_00 = pbVar14;
    if ((flags & 4) != 0) {
      iVar13 = *exp10;
      if (0x7ffffffe - iVar13 < num_digits && -1 < iVar13) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"number is too big");
        *(undefined ***)this = &PTR__format_error_001e9288;
        __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
      }
      uVar9 = (ulong)(num_digits + iVar13 + 1);
    }
  }
  iVar13 = (int)uVar9;
  if (-1 < iVar13) {
    *exp10 = *exp10 - (iVar13 + -1);
    uVar10 = iVar13 - 1;
    if (iVar13 == 0) {
      bigint::multiply(&local_240,10);
      iVar13 = add_compare(&local_2f0,&local_2f0,&local_240);
      sVar8 = buf->size_;
      uVar9 = sVar8 + 1;
      if (buf->capacity_ < uVar9) {
        (**buf->_vptr_buffer)(buf);
        sVar8 = buf->size_;
        uVar9 = sVar8 + 1;
      }
      buf->size_ = uVar9;
      buf->ptr_[sVar8] = 0 < iVar13 | 0x30;
    }
    else {
      uVar11 = buf->capacity_;
      if (uVar11 < uVar9) {
        (**buf->_vptr_buffer)(buf,uVar9);
        uVar11 = buf->capacity_;
      }
      if (uVar9 <= uVar11) {
        uVar11 = uVar9;
      }
      buf->size_ = uVar11;
      if (iVar13 != 1) {
        uVar11 = 0;
        do {
          iVar6 = bigint::divmod_assign(&local_2f0,&local_240);
          buf->ptr_[uVar11] = (char)iVar6 + '0';
          bigint::multiply(&local_2f0,10);
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      uVar7 = bigint::divmod_assign(&local_2f0,&local_240);
      iVar6 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar6) || ((uVar7 & 1) != 0 && iVar6 == 0)) {
        if (uVar7 == 9) {
          buf->ptr_[(int)uVar10] = ':';
          if (iVar13 != 1) {
            lVar12 = uVar9 + 1;
            do {
              if (buf->ptr_[lVar12 + -2] != ':') break;
              buf->ptr_[lVar12 + -2] = '0';
              buf->ptr_[lVar12 + -3] = buf->ptr_[lVar12 + -3] + '\x01';
              lVar12 = lVar12 + -1;
            } while (2 < lVar12);
          }
          if (*buf->ptr_ == ':') {
            *buf->ptr_ = '1';
            *exp10 = *exp10 + 1;
          }
          goto LAB_001348fa;
        }
        uVar7 = uVar7 + 1;
      }
      buf->ptr_[(int)uVar10] = (char)uVar7 + '0';
    }
    goto LAB_001348fa;
  }
  pcVar5 = buf->ptr_;
  lVar12 = 0;
  while( true ) {
    uVar7 = bigint::divmod_assign(&local_2f0,&local_240);
    iVar13 = compare(&local_2f0,&local_190);
    iVar6 = add_compare(&local_2f0,lhs2,&local_240);
    pcVar5[lVar12] = (char)uVar7 + '0';
    if ((iVar13 < (int)uVar10) || ((int)-uVar10 < iVar6)) break;
    bigint::multiply(&local_2f0,10);
    bigint::multiply(&local_190,10);
    if (this_00 != (bigint *)0x0) {
      bigint::multiply(this_00,10);
    }
    lVar12 = lVar12 + 1;
  }
  if (iVar13 < (int)uVar10) {
    if ((int)-uVar10 < iVar6) {
      iVar13 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar13) || ((uVar7 & 1) != 0 && iVar13 == 0)) goto LAB_00134754;
    }
  }
  else {
LAB_00134754:
    pcVar5 = pcVar5 + ((lVar12 + 1U & 0xffffffff) - 1);
    *pcVar5 = *pcVar5 + '\x01';
  }
  uVar11 = lVar12 + 1U & 0xffffffff;
  uVar9 = buf->capacity_;
  if (uVar9 < uVar11) {
    (**buf->_vptr_buffer)(buf,uVar11);
    uVar9 = buf->capacity_;
  }
  if (uVar9 < uVar11) {
    uVar11 = uVar9;
  }
  buf->size_ = uVar11;
  *exp10 = *exp10 - (int)lVar12;
LAB_001348fa:
  if (local_e0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar4) {
    operator_delete(local_e0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_e0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_190.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    operator_delete(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_190.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_240.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    operator_delete(local_240.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_240.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(basic_fp<uint128_t> value,
                                          unsigned flags, int num_digits,
                                          buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  bool is_predecessor_closer = (flags & dragon::predecessor_closer) != 0;
  int shift = is_predecessor_closer ? 2 : 1;
  if (value.e >= 0) {
    numerator = value.f;
    numerator <<= value.e + shift;
    lower = 1;
    lower <<= value.e;
    if (is_predecessor_closer) {
      upper_store = 1;
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (is_predecessor_closer) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= value.f;
    numerator <<= shift;
    denominator = 1;
    denominator <<= shift - value.e;
  } else {
    numerator = value.f;
    numerator <<= shift;
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower = 1;
    if (is_predecessor_closer) {
      upper_store = 1ULL << 1;
      upper = &upper_store;
    }
  }
  int even = static_cast<int>((value.f & 1) == 0);
  if (!upper) upper = &lower;
  if ((flags & dragon::fixup) != 0) {
    if (add_compare(numerator, *upper, denominator) + even <= 0) {
      --exp10;
      numerator *= 10;
      if (num_digits < 0) {
        lower *= 10;
        if (upper != &lower) *upper *= 10;
      }
    }
    if ((flags & dragon::fixed) != 0) adjust_precision(num_digits, exp10 + 1);
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}